

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_term(Parser *this)

{
  string *token;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  VM_Writer *pVVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  long *plVar8;
  ostream *poVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  string symbol;
  string cur_token_type;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  token = &this->cur_token;
  Tokenizer::type(&local_b0,this->tokenizer,token);
  iVar6 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar6 == 0) {
    poVar9 = (ostream *)this->out_file;
    std::operator+(&local_f0,"\t\t\t\t\t<identifier>",token);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    paVar1 = &local_110.field_2;
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_110._M_dataplus._M_p,local_110._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity =
         local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_110._M_dataplus._M_p = (pointer)paVar1;
    query_tokenizer(this);
    bVar5 = is_array(this);
    if (bVar5) {
      poVar9 = (ostream *)this->out_file;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t\t\t\t<symbol>[</symbol>",0x17)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      parse_expression(this);
      poVar9 = (ostream *)this->out_file;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t\t\t\t<symbol>]</symbol>",0x17)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    parse_subroutine_call(this);
LAB_0012f570:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0012f587;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar6 == 0) {
LAB_0012f0e8:
    std::__cxx11::string::compare((char *)&local_b0);
    poVar9 = (ostream *)this->out_file;
    std::operator+(&local_50,"\t\t\t\t\t<",&local_b0);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0 = &local_c0;
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_c0 = *plVar10;
      lStack_b8 = plVar8[3];
    }
    else {
      local_c0 = *plVar10;
      local_d0 = (long *)*plVar8;
    }
    local_c8 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(this->cur_token)._M_dataplus._M_p);
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar10;
      local_90 = (long *)*plVar8;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_60 = *plVar10;
      lStack_58 = plVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar10;
      local_70 = (long *)*plVar8;
    }
    local_68 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_b0._M_dataplus._M_p);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = plVar8[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_f0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar11;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_110._M_dataplus._M_p,local_110._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_b0);
    if (iVar6 == 0) goto LAB_0012f0e8;
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->keyword_constant_map)._M_t,token);
    if ((_Rb_tree_header *)cVar7._M_node !=
        &(this->keyword_constant_map)._M_t._M_impl.super__Rb_tree_header) goto LAB_0012f0e8;
    iVar6 = std::__cxx11::string::compare((char *)token);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)token);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)token);
        if (iVar6 != 0) goto LAB_0012f587;
      }
      poVar9 = (ostream *)this->out_file;
      std::operator+(&local_f0,"\t\t\t\t\t<symbol>",token);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      paVar1 = &local_110.field_2;
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_110.field_2._M_allocated_capacity = *puVar11;
        local_110.field_2._8_8_ = plVar8[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar11;
        local_110._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_110._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (this->cur_token)._M_dataplus._M_p;
      local_110._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (this->cur_token)._M_string_length);
      query_tokenizer(this);
      Tokenizer::type(&local_f0,this->tokenizer,token);
      iVar6 = std::__cxx11::string::compare((char *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (iVar6 == 0) {
        pVVar4 = this->vm_writer;
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"constant","");
        iVar6 = std::__cxx11::stoi(token,(size_t *)0x0,10);
        VM_Writer::write_push(pVVar4,&local_f0,iVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      parse_term(this);
      iVar6 = std::__cxx11::string::compare((char *)&local_110);
      pVVar4 = this->vm_writer;
      if (iVar6 == 0) {
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"neg","");
        VM_Writer::operator<<(pVVar4,&local_f0);
      }
      else {
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"~","");
        VM_Writer::write_arithmetic(pVVar4,&local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0012f570;
    }
    poVar9 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t\t\t\t<symbol>(</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    query_tokenizer(this);
    parse_expression(this);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,")","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"expression","");
    check_expected_x_after_y(this,&local_110,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    poVar9 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t\t\t\t\t<symbol>)</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  query_tokenizer(this);
LAB_0012f587:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::parse_term() {

    std::string cur_token_type = tokenizer.type(cur_token);
    if (cur_token_type == "IDENTIFIER") {
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string temp_identifier;

        query_tokenizer();
        if (is_array())
        {
            out_file << "\t\t\t\t\t<symbol>[</symbol>" << std::endl;
            parse_expression();
            out_file << "\t\t\t\t\t<symbol>]</symbol>" << std::endl;
        }
        parse_subroutine_call();
    }
    else if (cur_token_type == "STRING_CONST" || cur_token_type == "INT_CONST" ||
                                                                            keyword_constant_map.count(cur_token) > 0) {
        if (cur_token_type == "INT_CONST") {
        }
        out_file << "\t\t\t\t\t<" + cur_token_type +  ">" +
                    cur_token + "</" + cur_token_type + ">" << std::endl;
//        vm_writer.write_push("constant", std::stoi(cur_token));
        query_tokenizer();
    }
    else if(cur_token == "(") {
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();
        parse_expression();

        check_expected_x_after_y(")", "expression");
        out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
        query_tokenizer();
    }
    else if (cur_token == "-" || cur_token == "~") {
        out_file << "\t\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        // need to create an exception for int const values
        if (tokenizer.type(cur_token) == "INT_CONST") {
            vm_writer.write_push("constant", std::stoi(cur_token));
        }
        parse_term();
        if (symbol == "-") {
            vm_writer << "neg";
        }
        else {
            vm_writer.write_arithmetic("~");
        }
    }
}